

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.cpp
# Opt level: O1

Node * __thiscall itis::SplayTree::search(SplayTree *this,int x)

{
  Node *pNVar1;
  long lVar2;
  Node *pNVar3;
  Node *pNVar4;
  
  pNVar4 = this->root;
  if (this->root == (Node *)0x0) {
    pNVar1 = (Node *)0x0;
    pNVar3 = (Node *)0x0;
  }
  else {
    do {
      pNVar1 = pNVar4;
      lVar2 = 0x10;
      if ((pNVar1->data <= x) && (lVar2 = 0x18, pNVar3 = pNVar1, x <= pNVar1->data)) break;
      pNVar4 = *(Node **)((long)&pNVar1->data + lVar2);
      pNVar3 = (Node *)0x0;
    } while (pNVar4 != (Node *)0x0);
  }
  pNVar4 = pNVar3;
  if ((pNVar3 != (Node *)0x0) || (pNVar4 = pNVar1, pNVar1 != (Node *)0x0)) {
    splay(this,pNVar4);
  }
  return pNVar3;
}

Assistant:

Node *SplayTree::search(int x) {
    Node *ret = nullptr;
    Node *curr = this->root;
    Node *prev = nullptr;
    while (curr != nullptr) {
      prev = curr;
      if (x < curr->data) {
        curr = curr->left_child;
      } else if (x > curr->data) {
        curr = curr->right_child;
      } else {
        ret = curr;
        break;
      }
    }
    if (ret != nullptr) {
      splay(ret);
    } else if (prev != nullptr) {
      splay(prev);
    }
    return ret;
  }